

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::StringPtr&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [2],
          StringPtr *params_2,char (*params_3) [3],String *params_4)

{
  char *pcVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff88;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  undefined8 local_40;
  long local_38;
  ArrayPtr<const_char> local_30;
  
  local_40 = *(undefined8 *)this;
  local_38 = *(long *)(this + 8) + -1;
  local_50 = toCharSequence<char_const(&)[2]>((char (*) [2])params);
  local_60.ptr = *(char **)params_1;
  local_60.size_ = *(long *)(params_1 + 4) - 1;
  local_70 = toCharSequence<char_const(&)[3]>((char (*) [3])params_2);
  pcVar1 = *(char **)(params_3[2] + 2);
  local_30.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_30.ptr = *(char **)params_3;
  }
  local_30.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_30.size_ = (size_t)(pcVar1 + -1);
  }
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,&local_60,&local_70,&local_30,
             in_stack_ffffffffffffff88);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}